

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

uint dmrC_hexval(uint c)

{
  undefined4 local_10;
  int retval;
  uint c_local;
  
  local_10 = 0x100;
  if (c - 0x30 < 10) {
    local_10 = c - 0x30;
  }
  else if (c - 0x41 < 6) {
    local_10 = c - 0x37;
  }
  else if (c - 0x61 < 6) {
    local_10 = c - 0x57;
  }
  return local_10;
}

Assistant:

unsigned int dmrC_hexval(unsigned int c)
{
	int retval = 256;
	switch (c) {
	case '0':
	case '1':
	case '2':
	case '3':
	case '4':
	case '5':
	case '6':
	case '7':
	case '8':
	case '9':
		retval = c - '0';
		break;
	case 'a':
	case 'b':
	case 'c':
	case 'd':
	case 'e':
	case 'f':
		retval = c - 'a' + 10;
		break;
	case 'A':
	case 'B':
	case 'C':
	case 'D':
	case 'E':
	case 'F':
		retval = c - 'A' + 10;
		break;
	}
	return retval;
}